

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

void __thiscall TxRequestTracker::Impl::SanityCheck(Impl *this)

{
  long *__args;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar1;
  pointer poVar2;
  _Hash_node_base *p_Var3;
  _Base_ptr p_Var4;
  type tVar5;
  _Rb_tree_color *p_Var6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  Priority PVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  ulong uVar17;
  _Rb_tree_node_base *p_Var18;
  __node_base _Var19;
  _Link_type p_Var20;
  iterator __position;
  _Link_type __p;
  long lVar21;
  _Link_type p_Var22;
  _Hash_node_base *p_Var23;
  const_iterator __itx;
  _Hash_node_base *p_Var24;
  Announcement *ann;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar25;
  Announcement *ann_1;
  long in_FS_OFFSET;
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  ret;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *local_78;
  undefined1 local_70 [16];
  __node_base local_60;
  _Rb_tree_node_base *p_Stack_58;
  _Rb_tree_node_base *local_50;
  size_t local_48;
  __node_base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  poVar1 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  local_70._8_8_ = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Rb_tree_node_base *)0x0;
  local_50 = (_Rb_tree_node_base *)CONCAT44(local_50._4_4_,1.0);
  local_48 = 0;
  p_Stack_40 = (__node_base_ptr)0x0;
  poVar2 = (poVar1->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)&poVar2[-5].
                super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
  }
  local_70._0_8_ = &p_Stack_40;
  if (poVar25 != poVar1) {
    do {
      pmVar10 = std::
                unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                ::operator[]((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                              *)local_70,
                             (key_type *)
                             ((poVar25->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_.buf + 0x28));
      pmVar10->m_total = pmVar10->m_total + 1;
      pmVar10->m_requested =
           pmVar10->m_requested +
           (ulong)((*(ulong *)((long)&(poVar25->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x6000000000000000);
      pmVar10->m_completed = pmVar10->m_completed;
      local_78 = &poVar25->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_78);
      poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)((long)(local_78 + -5) + 0x10);
      if (local_78 ==
          (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)0x0) {
        poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)0x0;
      }
    } while (poVar25 != poVar1);
  }
  if (p_Stack_58 != (_Rb_tree_node_base *)(this->m_peerinfo)._M_h._M_element_count) {
LAB_00adfda5:
    __assert_fail("m_peerinfo == RecomputePeerInfo(m_index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                  ,0x149,"void TxRequestTracker::Impl::SanityCheck() const");
  }
  for (p_Var3 = (this->m_peerinfo)._M_h._M_before_begin._M_nxt; _Var19._M_nxt = local_60._M_nxt,
      p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    uVar17 = (ulong)p_Var3[1]._M_nxt % (ulong)local_70._8_8_;
    if (*(__node_base_ptr *)(local_70._0_8_ + uVar17 * 8) == (__node_base_ptr)0x0)
    goto LAB_00adfda5;
    p_Var24 = (*(__node_base_ptr *)(local_70._0_8_ + uVar17 * 8))->_M_nxt;
    p_Var23 = p_Var24[1]._M_nxt;
    while ((((p_Var23 != p_Var3[1]._M_nxt || (p_Var24[2]._M_nxt != p_Var3[2]._M_nxt)) ||
            (p_Var24[3]._M_nxt != p_Var3[3]._M_nxt)) || (p_Var24[4]._M_nxt != p_Var3[4]._M_nxt))) {
      p_Var24 = p_Var24->_M_nxt;
      if ((p_Var24 == (_Hash_node_base *)0x0) ||
         (p_Var23 = p_Var24[1]._M_nxt, (ulong)p_Var23 % (ulong)local_70._8_8_ != uVar17))
      goto LAB_00adfda5;
    }
  }
  while (_Var19._M_nxt != (_Hash_node_base *)0x0) {
    p_Var3 = (_Var19._M_nxt)->_M_nxt;
    operator_delete(_Var19._M_nxt,0x28);
    _Var19._M_nxt = p_Var3;
  }
  __position._M_current = (long *)0x0;
  memset((void *)local_70._0_8_,0,local_70._8_8_ << 3);
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Rb_tree_node_base *)0x0;
  if (&p_Stack_40 != (__node_base_ptr *)local_70._0_8_) {
    __position._M_current = (long *)(local_70._8_8_ << 3);
    operator_delete((void *)local_70._0_8_,(ulong)__position._M_current);
  }
  poVar1 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  p_Stack_58 = (_Rb_tree_node_base *)(local_70 + 8);
  local_70._8_8_ = local_70._8_8_ & 0xffffffff00000000;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  local_48 = 0;
  poVar2 = (poVar1->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)&poVar2[-5].
                super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
  }
  local_50 = p_Stack_58;
  if (poVar25 != poVar1) {
    do {
      bVar7 = true;
      p_Var16 = (_Rb_tree_node_base *)(local_70 + 8);
      _Var19._M_nxt = local_60._M_nxt;
      if ((_Rb_tree_node_base *)local_60._M_nxt == (_Rb_tree_node_base *)0x0) {
LAB_00adf949:
        p_Var11 = (_Rb_tree_node_base *)operator_new(0x88);
        p_Var18 = local_50;
        p_Var20 = (_Link_type)(p_Var11 + 1);
        tVar5 = (poVar25->
                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                ).
                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                .
                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.align_;
        p_Var15 = *(_Base_ptr *)
                   ((long)&(poVar25->
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                           .
                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                           .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                   + 8);
        p_Var4 = *(_Base_ptr *)
                  ((long)&(poVar25->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          .
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x18);
        p_Var11[1]._M_left =
             *(_Base_ptr *)
              ((long)&(poVar25->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                      ).
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      .
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
              0x10);
        p_Var11[1]._M_right = p_Var4;
        *(type *)(p_Var11 + 1) = tVar5;
        p_Var11[1]._M_parent = p_Var15;
        *(undefined8 *)(p_Var11 + 2) = 0;
        p_Var11[2]._M_parent = (_Base_ptr)0x0;
        p_Var11[2]._M_left = (_Base_ptr)0x0;
        p_Var11[2]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var11 + 3) = 0xffffffffffffffff;
        p_Var11[3]._M_parent = (_Base_ptr)0x0;
        p_Var11[3]._M_left = (_Base_ptr)0x0;
        p_Var11[3]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var11 + 4) = 0;
        if (bVar7) {
          if ((local_48 != 0) &&
             (__p = p_Var20, iVar9 = memcmp(local_50 + 1,p_Var20,0x20), iVar9 < 0)) {
LAB_00adfad8:
            p_Var13 = (_Rb_tree_node_base *)0x0;
            goto LAB_00adfada;
          }
LAB_00adfa72:
          p_Var12 = (_Rb_tree_node_base *)(local_70 + 8);
          _Var19._M_nxt = local_60._M_nxt;
          if ((_Rb_tree_node_base *)local_60._M_nxt == (_Rb_tree_node_base *)0x0) {
LAB_00adfaad:
            if (p_Var12 == p_Stack_58) goto LAB_00adfad4;
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
          }
          else {
            do {
              p_Var12 = (_Rb_tree_node_base *)_Var19._M_nxt;
              uVar8 = memcmp(p_Var20,p_Var12 + 1,0x20);
              _Var19._M_nxt = (_Hash_node_base *)(&p_Var12->_M_left)[~uVar8 >> 0x1f];
            } while ((&p_Var12->_M_left)[~uVar8 >> 0x1f] != (_Base_ptr)0x0);
            p_Var16 = p_Var12;
            if ((int)uVar8 < 0) goto LAB_00adfaad;
          }
          __p = p_Var20;
          iVar9 = memcmp(p_Var16 + 1,p_Var20,0x20);
          if (-1 < iVar9) goto LAB_00adfb25;
LAB_00adfad4:
          p_Var13 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var22 = (_Link_type)(p_Var16 + 1);
          __p = p_Var22;
          iVar9 = memcmp(p_Var20,p_Var22,0x20);
          if (-1 < iVar9) {
            __p = p_Var20;
            iVar9 = memcmp(p_Var22,p_Var20,0x20);
            if (iVar9 < 0) {
              p_Var18 = local_50;
              if (local_50 == p_Var16) goto LAB_00adfad8;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
              __p = (_Link_type)(p_Var13 + 1);
              iVar9 = memcmp(p_Var20,__p,0x20);
              if (-1 < iVar9) goto LAB_00adfa72;
              p_Var18 = p_Var13;
              p_Var12 = p_Var16;
              if (p_Var16->_M_right == (_Base_ptr)0x0) goto LAB_00adfad4;
              goto LAB_00adfada;
            }
LAB_00adfb25:
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
            ::_M_drop_node((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                            *)p_Var11,__p);
            goto LAB_00adfb30;
          }
          p_Var13 = p_Stack_58;
          p_Var18 = p_Stack_58;
          if (p_Stack_58 != p_Var16) {
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var16);
            __p = p_Var20;
            iVar9 = memcmp(p_Var12 + 1,p_Var20,0x20);
            if (-1 < iVar9) goto LAB_00adfa72;
            p_Var13 = p_Var16;
            p_Var18 = p_Var16;
            if (p_Var12->_M_right != (_Base_ptr)0x0) goto LAB_00adfada;
            goto LAB_00adfad4;
          }
LAB_00adfada:
          p_Var12 = p_Var18;
          p_Var16 = p_Var13;
          if (p_Var18 == (_Rb_tree_node_base *)0x0) goto LAB_00adfb25;
        }
        bVar7 = true;
        if ((p_Var13 == (_Rb_tree_node_base *)0x0) &&
           ((_Rb_tree_node_base *)(local_70 + 8) != p_Var12)) {
          iVar9 = memcmp(p_Var20,p_Var12 + 1,0x20);
          bVar7 = SUB41((uint)iVar9 >> 0x1f,0);
        }
        std::_Rb_tree_insert_and_rebalance
                  (bVar7,p_Var11,p_Var12,(_Rb_tree_node_base *)(local_70 + 8));
        local_48 = local_48 + 1;
        p_Var16 = p_Var11;
      }
      else {
        do {
          p_Var11 = p_Var16;
          p_Var18 = (_Rb_tree_node_base *)((long)_Var19._M_nxt + 0x20);
          uVar8 = memcmp(p_Var18,poVar25,0x20);
          p_Var16 = (_Rb_tree_node_base *)_Var19._M_nxt;
          if ((int)uVar8 < 0) {
            p_Var16 = p_Var11;
          }
          _Var19._M_nxt =
               (_Hash_node_base *)(&((_Rb_tree_node_base *)_Var19._M_nxt)->_M_left)[uVar8 >> 0x1f];
        } while ((_Base_ptr)_Var19._M_nxt != (_Base_ptr)0x0);
        if (p_Var16 == (_Rb_tree_node_base *)(local_70 + 8)) goto LAB_00adf949;
        if ((int)uVar8 < 0) {
          p_Var18 = p_Var11 + 1;
        }
        iVar9 = memcmp(poVar25,p_Var18,0x20);
        if (iVar9 < 0) {
          bVar7 = false;
          goto LAB_00adf949;
        }
      }
LAB_00adfb30:
      *(ulong *)(p_Var16 + 2) =
           *(long *)(p_Var16 + 2) +
           (ulong)(*(ulong *)((long)&(poVar25->
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                     .
                                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                     space.data_ + 0x30) < 0x2000000000000000);
      p_Var16[2]._M_parent =
           (_Base_ptr)
           ((long)&(p_Var16[2]._M_parent)->_M_color +
           (ulong)((*(ulong *)((long)&(poVar25->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x2000000000000000));
      p_Var16[2]._M_left =
           (_Base_ptr)
           ((long)&(p_Var16[2]._M_left)->_M_color +
           (ulong)((*(ulong *)((long)&(poVar25->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x4000000000000000));
      p_Var16[2]._M_right =
           (_Base_ptr)
           ((long)&(p_Var16[2]._M_right)->_M_color +
           (ulong)((*(ulong *)((long)&(poVar25->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x6000000000000000));
      uVar17 = *(ulong *)((long)&(poVar25->
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                 ).
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                 .
                                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                 .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                 data_ + 0x30);
      if ((uVar17 & 0xe000000000000000) == 0x4000000000000000) {
        PVar14 = anon_unknown.dwarf_3e3c455::PriorityComputer::operator()
                           ((PriorityComputer *)(this->m_computer).m_k0,
                            (uint256 *)(this->m_computer).m_k1,(NodeId)poVar25,
                            SUB81(*(undefined8 *)
                                   ((long)&(poVar25->
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                           ).
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                           .
                                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                           .
                                           super_pod_value_holder<(anonymous_namespace)::Announcement>
                                           .space.data_ + 0x28),0));
        *(Priority *)(p_Var16 + 3) = PVar14;
        uVar17 = *(ulong *)((long)&(poVar25->
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                   ).
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                   .
                                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                   space.data_ + 0x30);
      }
      if ((uVar17 & 0xe000000000000000) == 0x2000000000000000) {
        p_Var15 = (_Base_ptr)
                  anon_unknown.dwarf_3e3c455::PriorityComputer::operator()
                            ((PriorityComputer *)(this->m_computer).m_k0,
                             (uint256 *)(this->m_computer).m_k1,(NodeId)poVar25,
                             SUB81(*(undefined8 *)
                                    ((long)&(poVar25->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x28),0));
        if (p_Var15 < p_Var16[3]._M_parent) {
          p_Var15 = p_Var16[3]._M_parent;
        }
        p_Var16[3]._M_parent = p_Var15;
      }
      __args = (long *)((poVar25->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        .
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       + 0x28);
      __position._M_current = (long *)p_Var16[3]._M_right;
      if (__position._M_current == *(long **)(p_Var16 + 4)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&p_Var16[3]._M_left,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        __position._M_current = __position._M_current + 1;
        p_Var16[3]._M_right = (_Base_ptr)__position._M_current;
      }
      local_78 = &poVar25->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_78);
      poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)((long)(local_78 + -5) + 0x10);
      if (local_78 ==
          (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)0x0) {
        poVar25 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)0x0;
      }
      p_Var16 = p_Stack_58;
    } while (poVar25 != poVar1);
    for (; p_Var16 != (_Rb_tree_node_base *)(local_70 + 8);
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      p_Var15 = p_Var16[2]._M_parent;
      p_Var4 = p_Var16[2]._M_left;
      lVar21 = (long)&(p_Var16[2]._M_right)->_M_color +
               (long)&p_Var4->_M_color + (long)&p_Var15->_M_color + *(long *)(p_Var16 + 2);
      if (lVar21 == 0) {
        __assert_fail("info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x150,"void TxRequestTracker::Impl::SanityCheck() const");
      }
      uVar17 = (long)&p_Var4->_M_color + (long)&(p_Var16[2]._M_right)->_M_color;
      if (1 < uVar17) {
        __assert_fail("info.m_candidate_best + info.m_requested <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x153,"void TxRequestTracker::Impl::SanityCheck() const");
      }
      if (uVar17 != 1 && p_Var15 != (_Base_ptr)0x0) {
        __assert_fail("info.m_candidate_best + info.m_requested == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x158,"void TxRequestTracker::Impl::SanityCheck() const");
      }
      if ((p_Var4 != (_Base_ptr)0x0 && p_Var15 != (_Base_ptr)0x0) &&
         (*(_Base_ptr *)(p_Var16 + 3) < p_Var16[3]._M_parent)) {
        __assert_fail("info.m_priority_candidate_best >= info.m_priority_best_candidate_ready",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x15e,"void TxRequestTracker::Impl::SanityCheck() const");
      }
      p_Var20 = (_Link_type)p_Var16[3]._M_left;
      p_Var22 = (_Link_type)p_Var16[3]._M_right;
      __position._M_current = (long *)CONCAT71((int7)((ulong)lVar21 >> 8),p_Var15 == (_Base_ptr)0x0)
      ;
      if (p_Var20 != p_Var22) {
        uVar17 = (long)p_Var22 - (long)p_Var20 >> 3;
        lVar21 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var20,p_Var22,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var20);
        __position._M_current = (long *)p_Var22;
        if (p_Var16[3]._M_left != p_Var16[3]._M_right) {
          p_Var15 = (_Base_ptr)&(p_Var16[3]._M_left)->_M_parent;
          while (__position._M_current = (long *)p_Var22, p_Var15 != p_Var16[3]._M_right) {
            p_Var4 = p_Var15 + -1;
            p_Var22 = (_Link_type)&p_Var15->_M_parent;
            p_Var6 = &p_Var15->_M_color;
            p_Var15 = (_Base_ptr)p_Var22;
            if (p_Var4->_M_right == *(_Base_ptr *)p_Var6) {
              __assert_fail("std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end()"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                            ,0x163,"void TxRequestTracker::Impl::SanityCheck() const");
            }
          }
        }
      }
    }
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  ::_M_erase((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
              *)local_60._M_nxt,(_Link_type)__position._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SanityCheck() const
    {
        // Recompute m_peerdata from m_index. This verifies the data in it as it should just be caching statistics
        // on m_index. It also verifies the invariant that no PeerInfo announcements with m_total==0 exist.
        assert(m_peerinfo == RecomputePeerInfo(m_index));

        // Calculate per-txhash statistics from m_index, and validate invariants.
        for (auto& item : ComputeTxHashInfo(m_index, m_computer)) {
            TxHashInfo& info = item.second;

            // Cannot have only COMPLETED peer (txhash should have been forgotten already)
            assert(info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0);

            // Can have at most 1 CANDIDATE_BEST/REQUESTED peer
            assert(info.m_candidate_best + info.m_requested <= 1);

            // If there are any CANDIDATE_READY announcements, there must be exactly one CANDIDATE_BEST or REQUESTED
            // announcement.
            if (info.m_candidate_ready > 0) {
                assert(info.m_candidate_best + info.m_requested == 1);
            }

            // If there is both a CANDIDATE_READY and a CANDIDATE_BEST announcement, the CANDIDATE_BEST one must be
            // at least as good (equal or higher priority) as the best CANDIDATE_READY.
            if (info.m_candidate_ready && info.m_candidate_best) {
                assert(info.m_priority_candidate_best >= info.m_priority_best_candidate_ready);
            }

            // No txhash can have been announced by the same peer twice.
            std::sort(info.m_peers.begin(), info.m_peers.end());
            assert(std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end());
        }
    }